

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

int trytypeattr(rnndb *db,char *file,xmlNode *node,xmlAttr *attr,rnntypeinfo *ti)

{
  xmlChar *__s1;
  int iVar1;
  char *pcVar2;
  uint64_t uVar3;
  
  __s1 = attr->name;
  iVar1 = strcmp((char *)__s1,"shr");
  if (iVar1 == 0) {
    uVar3 = getnumattrib(db,file,(uint)node->line,attr);
    ti->shr = (int)uVar3;
  }
  else {
    iVar1 = strcmp((char *)__s1,"min");
    if (iVar1 == 0) {
      uVar3 = getnumattrib(db,file,(uint)node->line,attr);
      ti->min = uVar3;
      ti->minvalid = 1;
    }
    else {
      iVar1 = strcmp((char *)__s1,"max");
      if (iVar1 == 0) {
        uVar3 = getnumattrib(db,file,(uint)node->line,attr);
        ti->max = uVar3;
        ti->maxvalid = 1;
      }
      else {
        iVar1 = strcmp((char *)__s1,"align");
        if (iVar1 == 0) {
          uVar3 = getnumattrib(db,file,(uint)node->line,attr);
          ti->align = uVar3;
          ti->alignvalid = 1;
        }
        else {
          iVar1 = strcmp((char *)__s1,"type");
          if (iVar1 != 0) {
            return 0;
          }
          pcVar2 = getattrib(db,file,(uint)node->line,attr);
          pcVar2 = strdup(pcVar2);
          ti->name = pcVar2;
        }
      }
    }
  }
  return 1;
}

Assistant:

static int trytypeattr (struct rnndb *db, char *file, xmlNode *node, xmlAttr *attr, struct rnntypeinfo *ti) {
	if (!strcmp(attr->name, "shr")) {
		ti->shr = getnumattrib(db, file, node->line, attr);
		return 1;
	} else if (!strcmp(attr->name, "min")) {
		ti->min = getnumattrib(db, file, node->line, attr);
		ti->minvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "max")) {
		ti->max = getnumattrib(db, file, node->line, attr);
		ti->maxvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "align")) {
		ti->align = getnumattrib(db, file, node->line, attr);
		ti->alignvalid = 1;
		return 1;
	} else if (!strcmp(attr->name, "type")) {
		ti->name = strdup(getattrib(db, file, node->line, attr));;
		return 1;
	}
	return 0;
}